

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int detect_form(archive_read *a,int *is_form_d)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  byte *b;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  ssize_t sVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  size_t avail_00;
  byte bVar12;
  ulong uVar13;
  size_t sVar14;
  byte *p;
  byte *pbVar15;
  size_t sVar16;
  size_t sVar17;
  ssize_t avail;
  ssize_t nl;
  int local_60;
  int local_5c;
  size_t local_58;
  ulong local_50;
  ulong local_48;
  archive_read *local_40;
  int *local_38;
  
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  local_40 = a;
  b = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
  if (b == (byte *)0x0) {
    iVar4 = -1;
  }
  else {
    local_5c = 0;
    iVar4 = 0;
    local_60 = 0;
    sVar16 = local_58;
    local_38 = is_form_d;
LAB_00464c6b:
    local_50 = CONCAT44(local_50._4_4_,iVar4);
LAB_00464c72:
    avail_00 = local_58;
    if (local_58 == 0) {
      local_48 = 0;
      sVar5 = 0;
LAB_00464ca6:
      sVar14 = sVar16;
      sVar17 = avail_00;
      if (sVar5 != avail_00) goto LAB_0046509b;
      while( true ) {
        uVar13 = (ulong)((int)sVar14 + 0x3ffU & 0xfffffc00);
        pvVar6 = __archive_read_ahead
                           (local_40,uVar13 << (uVar13 < sVar14 + 0xa0),(ssize_t *)&local_58);
        pvVar7 = pvVar6;
        if (pvVar6 == (void *)0x0) {
          if ((long)local_58 <= (long)sVar14) {
            sVar5 = 0;
            goto LAB_0046509b;
          }
          pvVar7 = __archive_read_ahead(local_40,local_58,(ssize_t *)&local_58);
        }
        sVar16 = local_58;
        b = (byte *)((long)pvVar7 + (sVar14 - sVar17));
        avail_00 = local_58 - (sVar14 - sVar17);
        local_58 = avail_00;
        sVar8 = get_line_size((char *)b,avail_00,(ssize_t *)&local_48);
        sVar5 = 0;
        if (-1 < sVar8) {
          sVar5 = sVar17;
        }
        sVar5 = sVar5 + sVar8;
        if (local_48 != 0) break;
        if ((pvVar6 == (void *)0x0) || (sVar14 = sVar16, sVar17 = avail_00, sVar5 != avail_00))
        goto LAB_0046509b;
      }
    }
    else {
      sVar5 = get_line_size((char *)b,local_58,(ssize_t *)&local_48);
      if (local_48 == 0) goto LAB_00464ca6;
    }
    uVar13 = local_48;
    if ((long)sVar5 < 1) goto LAB_0046509b;
    if ((int)local_50 != 0) {
      iVar4 = bid_keyword_list((char *)b,sVar5,0,0);
      if (iVar4 < 1) {
        sVar5 = 1;
        goto LAB_0046509b;
      }
      b = b + sVar5;
      iVar4 = (int)local_50;
      if ((b[~uVar13] != 0x5c) && (iVar4 = 0, (int)local_50 == 1)) {
        if (1 < local_5c) goto LAB_004650af;
        local_5c = local_5c + 1;
        iVar4 = 0;
      }
      local_58 = avail_00 - sVar5;
      local_50 = CONCAT44(local_50._4_4_,iVar4);
      goto LAB_00464c72;
    }
    pbVar15 = b + sVar5;
    do {
      bVar12 = *b;
      if ((bVar12 != 0x20) && (bVar12 != 9)) {
        bVar3 = true;
        goto LAB_00464e0d;
      }
      b = b + 1;
      avail_00 = avail_00 - 1;
      bVar3 = 1 < (long)sVar5;
      sVar5 = sVar5 - 1;
      local_58 = avail_00;
    } while (bVar3);
    bVar12 = *pbVar15;
    sVar5 = 0;
    bVar3 = false;
    b = pbVar15;
LAB_00464e0d:
    uVar9 = (ulong)bVar12;
    if (bVar12 < 0x23) {
      if ((bVar12 != 10) && (bVar12 != 0xd)) goto LAB_00464e89;
LAB_00464e26:
      b = b + sVar5;
      local_58 = avail_00 - sVar5;
      goto LAB_00464c72;
    }
    if (bVar12 == 0x23) goto LAB_00464e26;
    if (bVar12 == 0x2f) {
      iVar4 = strncmp((char *)b,"/set",4);
      if (iVar4 == 0) {
        pbVar15 = b + 4;
        lVar11 = sVar5 - 4;
        iVar4 = 0;
      }
      else {
        iVar4 = strncmp((char *)b,"/unset",6);
        if (iVar4 != 0) goto LAB_0046509b;
        pbVar15 = b + 6;
        lVar11 = sVar5 - 6;
        iVar4 = 1;
      }
      iVar4 = bid_keyword_list((char *)pbVar15,lVar11,iVar4,0);
      if (iVar4 < 1) goto LAB_0046509b;
      iVar4 = (uint)(b[~uVar13 + sVar5] == 0x5c) * 2;
      goto LAB_0046507d;
    }
LAB_00464e89:
    pbVar15 = b + sVar5;
    if (bVar3) {
      pcVar1 = bid_entry_safe_char + uVar9;
      p = b;
      sVar14 = sVar5;
      cVar2 = *pcVar1;
      while (cVar2 != '\0') {
        p = p + 1;
        sVar14 = sVar14 - 1;
        if (pbVar15 <= p) goto LAB_00464fcb;
        uVar9 = (ulong)*p;
        cVar2 = bid_entry_safe_char[uVar9];
      }
      if (((0x20 < (byte)uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) || (*pcVar1 == '\0')
         ) goto LAB_00464ef8;
      sVar14 = (long)pbVar15 - (long)p;
LAB_00464fcb:
      iVar4 = 0;
      bVar3 = true;
LAB_0046500d:
      local_50 = local_48;
      iVar4 = bid_keyword_list((char *)p,sVar14,0,iVar4);
      if (iVar4 < 0) goto LAB_0046509b;
      if (local_60 == 1) {
        if (!(bool)(bVar3 & iVar4 != 0)) goto LAB_00465059;
        local_60 = 1;
        goto LAB_0046509b;
      }
      if (local_60 == 0) {
        local_60 = 1;
        if (!bVar3) goto LAB_0046506c;
        local_60 = -(uint)(iVar4 != 0);
LAB_0046505e:
        iVar4 = 1;
        if (pbVar15[~local_50] != 0x5c) goto LAB_0046506c;
      }
      else {
LAB_00465059:
        if (bVar3) goto LAB_0046505e;
LAB_0046506c:
        if (1 < local_5c) goto LAB_004650af;
        local_5c = local_5c + 1;
        iVar4 = 0;
      }
LAB_0046507d:
      b = b + sVar5;
      local_58 = avail_00 - sVar5;
      goto LAB_00464c6b;
    }
LAB_00464ef8:
    lVar11 = -local_48;
    if ((((pbVar15 + lVar11 + -2 < b) || (pbVar15[lVar11 + -1] != 0x5c)) ||
        ((bVar12 = pbVar15[lVar11 + -2], bVar12 != 9 && (bVar12 != 0x20)))) &&
       ((b <= pbVar15 + lVar11 + -1 && (bVar12 = pbVar15[lVar11 + -1], bVar12 != 0x5c)))) {
      lVar11 = sVar5 - local_48;
      bVar3 = false;
      uVar10 = 0;
      while( true ) {
        if ((bVar12 == 9) || (bVar12 == 0x20)) goto LAB_00464fda;
        if (bid_entry_safe_char[bVar12] == '\0') goto LAB_0046509b;
        if (bVar12 == 0x2f) {
          bVar3 = true;
        }
        if (b + lVar11 + -2 < b) break;
        bVar12 = b[lVar11 + -2];
        lVar11 = lVar11 + -1;
        uVar10 = uVar10 + 1;
      }
      lVar11 = lVar11 + -1;
      uVar10 = uVar10 + 1;
LAB_00464fda:
      if (((uVar10 != 0) && (bVar3)) && (b[lVar11] != 0x2f)) {
        sVar14 = sVar5 - (uVar10 + local_48);
        iVar4 = 1;
        bVar3 = false;
        p = b;
        goto LAB_0046500d;
      }
    }
LAB_0046509b:
    if (local_5c < 3) {
      if (local_5c < 1) {
        return 0;
      }
      if (sVar5 != 0) {
        return 0;
      }
    }
LAB_004650af:
    iVar4 = 0x20;
    if ((local_38 != (int *)0x0) && (local_60 == 1)) {
      *local_38 = 1;
    }
  }
  return iVar4;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}